

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

void __thiscall Klex::~Klex(Klex *this)

{
  Klex *this_local;
  
  fclose((FILE *)this->file);
  std::__cxx11::string::~string((string *)&this->lexeme);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
  ::~unordered_map(&this->lexToTokenTable);
  return;
}

Assistant:

Klex::~Klex() {
    fclose(file);
}